

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_c1a11d::LevelTest::~LevelTest(LevelTest *this)

{
  code *pcVar1;
  LevelTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~LevelTest() override = default;